

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed>
::operator=(SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed>
            *this,SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed>
                  *RHS)

{
  Unparsed *__first;
  Unparsed *pUVar1;
  Unparsed *pUVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  Unparsed *__cur;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  Unparsed *__result;
  
  if (this == RHS) {
    return this;
  }
  __first = (Unparsed *)
            (RHS->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
            ).
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
            .super_SmallVectorBase.BeginX;
  pUVar1 = (Unparsed *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  uVar9 = (long)pUVar1 - (long)__first;
  __result = (Unparsed *)
             (this->
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
             .super_SmallVectorBase.BeginX;
  pUVar2 = (Unparsed *)
           (this->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  lVar8 = (long)pUVar2 - (long)__result;
  uVar5 = lVar8 / 0x18;
  if ((ulong)((long)uVar9 / 0x18) <= uVar5) {
    if (pUVar1 != __first) {
      __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
                 __copy_m<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<23u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<28u,Fixpp::Type::Char>>,Fixpp::TagT<26u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<27u,Fixpp::Type::St___Type::String>>,Fixpp::TagT<218u,Fixpp::Type::Float>,Fixpp::TagT<219u,Fixpp::Type::Char>>::Unparsed*>
                           (__first,(Unparsed *)(uVar9 + (long)__first),__result);
    }
    goto LAB_009fe0a9;
  }
  if ((ulong)((long)(this->
                    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
                    .super_SmallVectorBase.CapacityX - (long)__result) < uVar9) {
    (this->
    super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
    .super_SmallVectorBase.EndX = __result;
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ::grow(&this->
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ,(long)uVar9 / 0x18);
LAB_009fe072:
    uVar5 = 0;
  }
  else {
    if (pUVar2 == __result) goto LAB_009fe072;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<23u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<28u,Fixpp::Type::Char>>,Fixpp::TagT<26u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<27u,Fixpp::Type::St___Type::String>>,Fixpp::TagT<218u,Fixpp::Type::Float>,Fixpp::TagT<219u,Fixpp::Type::Char>>::Unparsed*>
              (__first,(Unparsed *)(lVar8 + (long)__first),__result);
  }
  puVar3 = (undefined8 *)
           (RHS->
           super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
           ).
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
           .super_SmallVectorBase.EndX;
  puVar6 = (undefined8 *)
           (uVar5 * 0x18 +
           (long)(this->
                 super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
                 ).
                 super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
                 .super_SmallVectorBase.BeginX);
  for (puVar7 = (undefined8 *)
                ((long)(RHS->
                       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
                       ).
                       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
                       .super_SmallVectorBase.BeginX + uVar5 * 0x18); puVar7 != puVar3;
      puVar7 = puVar7 + 3) {
    puVar6[2] = puVar7[2];
    uVar4 = puVar7[1];
    *puVar6 = *puVar7;
    puVar6[1] = uVar4;
    puVar6 = puVar6 + 3;
  }
  __result = (Unparsed *)
             (uVar9 + (long)(this->
                            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
                            ).
                            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
                            .super_SmallVectorBase.BeginX);
LAB_009fe0a9:
  (this->
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX = __result;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}